

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void CompatibilityCVT_Resampler(SDL12_AudioCVT *cvt12,Uint16 format)

{
  Uint8 UVar1;
  Uint16 UVar2;
  code *pcVar3;
  ushort uVar4;
  SDL_AssertState SVar5;
  int iVar6;
  Uint16 *local_70;
  Uint16 *dst_3;
  Uint16 *src_3;
  Uint8 *dst_2;
  Uint8 *src_2;
  Uint16 *pUStack_48;
  Uint16 sample_1;
  Uint16 *dst_1;
  Uint16 *src_1;
  Uint8 *pUStack_30;
  Uint8 sample;
  Uint8 *dst;
  Uint8 *src;
  SDL_AssertState sdl_assert_state;
  int i;
  int bitsize;
  Uint16 format_local;
  SDL12_AudioCVT *cvt12_local;
  
  uVar4 = format & 0xff;
  do {
    if (uVar4 == 8 || uVar4 == 0x10) goto LAB_0011895a;
    SVar5 = (*SDL20_ReportAssertion)
                      (&CompatibilityCVT_Resampler::sdl_assert_data,"CompatibilityCVT_Resampler",
                       "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                       ,0x26d2);
  } while (SVar5 == SDL_ASSERTION_RETRY);
  if (SVar5 == SDL_ASSERTION_BREAK) {
    pcVar3 = (code *)swi(3);
    (*pcVar3)();
    return;
  }
LAB_0011895a:
  if (1.0 < cvt12->rate_incr || cvt12->rate_incr == 1.0) {
    if (uVar4 == 8) {
      dst_2 = cvt12->buf;
      src_3 = (Uint16 *)cvt12->buf;
      for (src._4_4_ = (int)((ulong)(long)cvt12->len_cvt >> 1); src._4_4_ != 0;
          src._4_4_ = src._4_4_ + -1) {
        *(Uint8 *)src_3 = *dst_2;
        dst_2 = dst_2 + 2;
        src_3 = (Uint16 *)((long)src_3 + 1);
      }
    }
    else if (uVar4 == 0x10) {
      dst_3 = (Uint16 *)cvt12->buf;
      local_70 = (Uint16 *)cvt12->buf;
      for (src._4_4_ = (int)((ulong)(long)cvt12->len_cvt >> 2); src._4_4_ != 0;
          src._4_4_ = src._4_4_ + -1) {
        *local_70 = *dst_3;
        dst_3 = dst_3 + 2;
        local_70 = local_70 + 1;
      }
    }
    cvt12->len_cvt = cvt12->len_cvt / 2;
  }
  else {
    if (uVar4 == 8) {
      pUStack_30 = cvt12->buf + (cvt12->len_cvt << 1);
      dst = cvt12->buf + cvt12->len_cvt;
      for (src._4_4_ = cvt12->len_cvt; src._4_4_ != 0; src._4_4_ = src._4_4_ + -1) {
        UVar1 = dst[-1];
        pUStack_30[-1] = UVar1;
        pUStack_30[-2] = UVar1;
        pUStack_30 = pUStack_30 + -2;
        dst = dst + -1;
      }
    }
    else if (uVar4 == 0x10) {
      pUStack_48 = (Uint16 *)(cvt12->buf + (cvt12->len_cvt << 1));
      dst_1 = (Uint16 *)(cvt12->buf + cvt12->len_cvt);
      for (src._4_4_ = (int)((ulong)(long)cvt12->len_cvt >> 1); src._4_4_ != 0;
          src._4_4_ = src._4_4_ + -1) {
        UVar2 = dst_1[-1];
        pUStack_48[-1] = UVar2;
        pUStack_48[-2] = UVar2;
        pUStack_48 = pUStack_48 + -2;
        dst_1 = dst_1 + -1;
      }
    }
    cvt12->len_cvt = cvt12->len_cvt << 1;
  }
  iVar6 = cvt12->filter_index + 1;
  cvt12->filter_index = iVar6;
  if (cvt12->filters[iVar6] != (SDL12_AudioCVTFilter)0x0) {
    (*cvt12->filters[cvt12->filter_index])(cvt12,format);
  }
  return;
}

Assistant:

static void SDLCALL
CompatibilityCVT_Resampler(SDL12_AudioCVT *cvt12, Uint16 format)
{
    const int bitsize = (int) SDL_AUDIO_BITSIZE(format);
    int i;

    SDL_assert((bitsize == 8) || (bitsize == 16));  /* there were no 32-bit audio types in 1.2. */

    if (cvt12->rate_incr < 1.0) {   /* upsampling */
        /*printf("2x Upsampling!\n");*/
        #define DO_RESAMPLE(typ) \
            const typ *src = (const typ *) (cvt12->buf + cvt12->len_cvt); \
            typ *dst = (typ *) (cvt12->buf + (cvt12->len_cvt * 2)); \
            for (i = cvt12->len_cvt / sizeof (typ); i; i--) { \
                const typ sample = *(--src); \
                dst -= 2; \
                dst[0] = dst[1] = sample; \
            }
        if (bitsize == 8) {
            DO_RESAMPLE(Uint8);
        } else if (bitsize == 16) {
            DO_RESAMPLE(Uint16);
        }
        #undef DO_RESAMPLE
        cvt12->len_cvt *= 2;
    } else {  /* downsampling. */
        /*printf("2x Downsampling!\n");*/
        #define DO_RESAMPLE(typ) \
            const typ *src = (const typ *) cvt12->buf; \
            typ *dst = (typ *) cvt12->buf; \
            for (i = cvt12->len_cvt / (sizeof (typ) * 2); i; i--, src += 2) { \
                *(dst++) = *src; \
            }
        if (bitsize == 8) {
            DO_RESAMPLE(Uint8);
        } else if (bitsize == 16) {
            DO_RESAMPLE(Uint16);
        }
        #undef DO_RESAMPLE
        cvt12->len_cvt /= 2;
    }

    if (cvt12->filters[++cvt12->filter_index]) {
        cvt12->filters[cvt12->filter_index](cvt12, format);
    }
}